

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3WhereExplainOneScan(Parse *pParse,SrcList *pTabList,WhereLevel *pLevel,u16 wctrlFlags)

{
  byte bVar1;
  ushort uVar2;
  short sVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  Index *pIdx;
  Parse *pPVar6;
  uint uVar7;
  uint uVar8;
  int addr;
  Parse *extraout_RAX;
  char *pcVar9;
  ulong uVar10;
  char *zFormat;
  uint bAnd;
  SrcItem *pSVar11;
  Vdbe *p;
  bool bVar12;
  char zBuf [100];
  StrAccum local_d0;
  Parse *local_b0;
  Vdbe *local_a8;
  SrcItem *local_a0;
  char local_98 [104];
  
  local_b0 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    local_b0 = pParse;
  }
  if (local_b0->explain != '\x02') goto LAB_0019efc9;
  local_b0 = (Parse *)pLevel->pWLoop;
  uVar7 = local_b0->nErr;
  if (((uVar7 >> 0xd & 1) != 0) || ((wctrlFlags & 0x20) != 0)) goto LAB_0019efc9;
  bVar1 = pLevel->iFrom;
  pSVar11 = pTabList->a + bVar1;
  local_d0.db = pParse->db;
  bVar12 = true;
  if (((uVar7 & 0x30) == 0) &&
     (((uVar7 >> 10 & 1) != 0 ||
      ((((anon_union_24_2_d889f21e_for_u *)&local_b0->rc)->btree).nEq == 0)))) {
    bVar12 = (wctrlFlags & 3) != 0;
  }
  p = pParse->pVdbe;
  local_d0.zText = local_98;
  local_d0.nAlloc = 100;
  local_d0.mxAlloc = 1000000000;
  local_d0.nChar = 0;
  local_d0.accError = '\0';
  local_d0.printfFlags = '\x01';
  pcVar9 = "SCAN";
  if (bVar12) {
    pcVar9 = "SEARCH";
  }
  sqlite3_str_appendf(&local_d0,"%s %S",pcVar9,pSVar11);
  pPVar6 = local_b0;
  local_a0 = pSVar11;
  if ((uVar7 & 0x500) == 0) {
    puVar5 = *(undefined8 **)&local_b0->isMultiWrite;
    if ((((pTabList->a[bVar1].pTab)->tabFlags & 0x80) == 0) ||
       ((*(ushort *)((long)puVar5 + 99) & 3) != 2)) {
      if ((uVar7 >> 0x11 & 1) == 0) {
        if ((uVar7 >> 0xe & 1) == 0) {
          pcVar9 = "COVERING INDEX %s";
          if ((uVar7 & 0x40) == 0) {
            pcVar9 = "INDEX %s";
          }
        }
        else {
          pcVar9 = "AUTOMATIC COVERING INDEX";
        }
      }
      else {
        pcVar9 = "AUTOMATIC PARTIAL COVERING INDEX";
      }
    }
    else {
      if (!bVar12) goto LAB_0019ef6f;
      pcVar9 = "PRIMARY KEY";
    }
    if (local_d0.nChar + 7 < local_d0.nAlloc) {
      builtin_strncpy(local_d0.zText + local_d0.nChar," USING ",7);
      local_d0.nChar = local_d0.nChar + 7;
    }
    else {
      enlargeAndAppend(&local_d0," USING ",7);
    }
    sqlite3_str_appendf(&local_d0,pcVar9,*puVar5);
    pIdx = *(Index **)&pPVar6->isMultiWrite;
    uVar2 = *(u16 *)((long)&pPVar6->nTab + 2);
    uVar7 = (uint)(((anon_union_24_2_d889f21e_for_u *)&pPVar6->rc)->btree).nEq;
    if ((uVar7 != 0) || ((pPVar6->nErr & 0x30U) != 0)) {
      local_a8 = p;
      if (local_d0.nChar + 2 < local_d0.nAlloc) {
        (local_d0.zText + local_d0.nChar)[0] = ' ';
        (local_d0.zText + local_d0.nChar)[1] = '(';
        local_d0.nChar = local_d0.nChar + 2;
      }
      else {
        enlargeAndAppend(&local_d0," (",2);
      }
      if (uVar7 != 0) {
        uVar10 = 0;
        do {
          sVar3 = pIdx->aiColumn[uVar10];
          pcVar9 = "<expr>";
          if (sVar3 != -2) {
            if (sVar3 == -1) {
              pcVar9 = "rowid";
            }
            else {
              pcVar9 = pIdx->pTable->aCol[sVar3].zCnName;
            }
          }
          if (uVar10 != 0) {
            if (local_d0.nChar + 5 < local_d0.nAlloc) {
              builtin_strncpy(local_d0.zText + local_d0.nChar," AND ",5);
              local_d0.nChar = local_d0.nChar + 5;
            }
            else {
              enlargeAndAppend(&local_d0," AND ",5);
            }
          }
          zFormat = "%s=?";
          if (uVar10 < uVar2) {
            zFormat = "ANY(%s)";
          }
          sqlite3_str_appendf(&local_d0,zFormat,pcVar9);
          uVar10 = uVar10 + 1;
        } while (uVar7 != uVar10);
      }
      pPVar6 = local_b0;
      uVar8 = local_b0->nErr;
      bAnd = uVar7;
      if ((uVar8 & 0x20) != 0) {
        explainAppendTerm(&local_d0,pIdx,
                          (uint)(((anon_union_24_2_d889f21e_for_u *)&local_b0->rc)->btree).nBtm,
                          uVar7,uVar7,">");
        uVar8 = pPVar6->nErr;
        bAnd = 1;
      }
      p = local_a8;
      if ((uVar8 & 0x10) != 0) {
        uVar2._0_1_ = pPVar6->colNamesSet;
        uVar2._1_1_ = pPVar6->checkSchema;
        explainAppendTerm(&local_d0,pIdx,(uint)uVar2,uVar7,bAnd,"<");
      }
      if (local_d0.nChar + 1 < local_d0.nAlloc) {
        local_d0.zText[local_d0.nChar] = ')';
        local_d0.nChar = local_d0.nChar + 1;
      }
      else {
        enlargeAndAppend(&local_d0,")",1);
      }
    }
  }
  else if ((uVar7 & 0xf) == 0 || (uVar7 >> 8 & 1) == 0) {
    if ((uVar7 >> 10 & 1) != 0) {
      uVar4._0_1_ = local_b0->isMultiWrite;
      uVar4._1_1_ = local_b0->mayAbort;
      uVar4._2_1_ = local_b0->hasCompound;
      uVar4._3_1_ = local_b0->okConstFactor;
      uVar4._4_1_ = local_b0->disableLookaside;
      uVar4._5_1_ = local_b0->prepFlags;
      uVar4._6_1_ = local_b0->withinRJSubrtn;
      uVar4._7_1_ = local_b0->field_0x27;
      sqlite3_str_appendf(&local_d0," VIRTUAL TABLE INDEX %d:%s",
                          (ulong)(uint)(((anon_union_24_2_d889f21e_for_u *)&local_b0->rc)->vtab).
                                       idxNum,uVar4);
    }
  }
  else {
    sqlite3_str_appendf(&local_d0," USING INTEGER PRIMARY KEY (%s","rowid");
    uVar10 = 0x3d;
    if ((uVar7 & 5) == 0) {
      if ((uVar7 & 0x30) == 0x30) {
        sqlite3_str_appendf(&local_d0,">? AND %s","rowid");
        uVar10 = 0x3c;
      }
      else {
        uVar10 = (ulong)((uVar7 & 0x20) >> 4 | 0x3c);
      }
    }
    sqlite3_str_appendf(&local_d0,"%c?)",uVar10);
  }
LAB_0019ef6f:
  if (((local_a0->fg).jointype & 8) != 0) {
    sqlite3_str_appendf(&local_d0," LEFT-JOIN");
  }
  pcVar9 = sqlite3StrAccumFinish(&local_d0);
  addr = sqlite3VdbeAddOp3(p,0xb9,p->nOp,pParse->addrExplain,0);
  sqlite3VdbeChangeP4(p,addr,pcVar9,-6);
  local_b0 = extraout_RAX;
LAB_0019efc9:
  return (int)local_b0;
}

Assistant:

SQLITE_PRIVATE int sqlite3WhereExplainOneScan(
  Parse *pParse,                  /* Parse context */
  SrcList *pTabList,              /* Table list this loop refers to */
  WhereLevel *pLevel,             /* Scan to write OP_Explain opcode for */
  u16 wctrlFlags                  /* Flags passed to sqlite3WhereBegin() */
){
  int ret = 0;
#if !defined(SQLITE_DEBUG) && !defined(SQLITE_ENABLE_STMT_SCANSTATUS)
  if( sqlite3ParseToplevel(pParse)->explain==2 )
#endif
  {
    SrcItem *pItem = &pTabList->a[pLevel->iFrom];
    Vdbe *v = pParse->pVdbe;      /* VM being constructed */
    sqlite3 *db = pParse->db;     /* Database handle */
    int isSearch;                 /* True for a SEARCH. False for SCAN. */
    WhereLoop *pLoop;             /* The controlling WhereLoop object */
    u32 flags;                    /* Flags that describe this loop */
    char *zMsg;                   /* Text to add to EQP output */
    StrAccum str;                 /* EQP output string */
    char zBuf[100];               /* Initial space for EQP output string */

    pLoop = pLevel->pWLoop;
    flags = pLoop->wsFlags;
    if( (flags&WHERE_MULTI_OR) || (wctrlFlags&WHERE_OR_SUBCLAUSE) ) return 0;

    isSearch = (flags&(WHERE_BTM_LIMIT|WHERE_TOP_LIMIT))!=0
            || ((flags&WHERE_VIRTUALTABLE)==0 && (pLoop->u.btree.nEq>0))
            || (wctrlFlags&(WHERE_ORDERBY_MIN|WHERE_ORDERBY_MAX));

    sqlite3StrAccumInit(&str, db, zBuf, sizeof(zBuf), SQLITE_MAX_LENGTH);
    str.printfFlags = SQLITE_PRINTF_INTERNAL;
    sqlite3_str_appendf(&str, "%s %S", isSearch ? "SEARCH" : "SCAN", pItem);
    if( (flags & (WHERE_IPK|WHERE_VIRTUALTABLE))==0 ){
      const char *zFmt = 0;
      Index *pIdx;

      assert( pLoop->u.btree.pIndex!=0 );
      pIdx = pLoop->u.btree.pIndex;
      assert( !(flags&WHERE_AUTO_INDEX) || (flags&WHERE_IDX_ONLY) );
      if( !HasRowid(pItem->pTab) && IsPrimaryKeyIndex(pIdx) ){
        if( isSearch ){
          zFmt = "PRIMARY KEY";
        }
      }else if( flags & WHERE_PARTIALIDX ){
        zFmt = "AUTOMATIC PARTIAL COVERING INDEX";
      }else if( flags & WHERE_AUTO_INDEX ){
        zFmt = "AUTOMATIC COVERING INDEX";
      }else if( flags & WHERE_IDX_ONLY ){
        zFmt = "COVERING INDEX %s";
      }else{
        zFmt = "INDEX %s";
      }
      if( zFmt ){
        sqlite3_str_append(&str, " USING ", 7);
        sqlite3_str_appendf(&str, zFmt, pIdx->zName);
        explainIndexRange(&str, pLoop);
      }
    }else if( (flags & WHERE_IPK)!=0 && (flags & WHERE_CONSTRAINT)!=0 ){
      char cRangeOp;
#if 0  /* Better output, but breaks many tests */
      const Table *pTab = pItem->pTab;
      const char *zRowid = pTab->iPKey>=0 ? pTab->aCol[pTab->iPKey].zCnName:
                              "rowid";
#else
      const char *zRowid = "rowid";
#endif
      sqlite3_str_appendf(&str, " USING INTEGER PRIMARY KEY (%s", zRowid);
      if( flags&(WHERE_COLUMN_EQ|WHERE_COLUMN_IN) ){
        cRangeOp = '=';
      }else if( (flags&WHERE_BOTH_LIMIT)==WHERE_BOTH_LIMIT ){
        sqlite3_str_appendf(&str, ">? AND %s", zRowid);
        cRangeOp = '<';
      }else if( flags&WHERE_BTM_LIMIT ){
        cRangeOp = '>';
      }else{
        assert( flags&WHERE_TOP_LIMIT);
        cRangeOp = '<';
      }
      sqlite3_str_appendf(&str, "%c?)", cRangeOp);
    }
#ifndef SQLITE_OMIT_VIRTUALTABLE
    else if( (flags & WHERE_VIRTUALTABLE)!=0 ){
      sqlite3_str_appendf(&str, " VIRTUAL TABLE INDEX %d:%s",
                  pLoop->u.vtab.idxNum, pLoop->u.vtab.idxStr);
    }
#endif
    if( pItem->fg.jointype & JT_LEFT ){
      sqlite3_str_appendf(&str, " LEFT-JOIN");
    }
#ifdef SQLITE_EXPLAIN_ESTIMATED_ROWS
    if( pLoop->nOut>=10 ){
      sqlite3_str_appendf(&str, " (~%llu rows)",
             sqlite3LogEstToInt(pLoop->nOut));
    }else{
      sqlite3_str_append(&str, " (~1 row)", 9);
    }
#endif
    zMsg = sqlite3StrAccumFinish(&str);
    sqlite3ExplainBreakpoint("",zMsg);
    ret = sqlite3VdbeAddOp4(v, OP_Explain, sqlite3VdbeCurrentAddr(v),
                            pParse->addrExplain, 0, zMsg,P4_DYNAMIC);
  }
  return ret;
}